

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegion *
memory_cow_sparc64(uc_struct_conflict9 *uc,MemoryRegion *current,hwaddr begin,size_t size)

{
  hwaddr hVar1;
  hwaddr offset_00;
  void *__dest;
  void *__src;
  MemoryRegion *ram;
  hwaddr current_offset;
  hwaddr offset;
  size_t size_local;
  hwaddr begin_local;
  MemoryRegion *current_local;
  uc_struct_conflict9 *uc_local;
  
  uc_local = (uc_struct_conflict9 *)g_malloc_n(1,0xa0);
  if (current->container == uc->system_memory) {
    make_contained(uc,current);
  }
  offset_00 = begin - current->container->addr;
  hVar1 = current->addr;
  memory_region_init_ram_sparc64(uc,(MemoryRegion *)uc_local,size,current->perms);
  if (((uc_local->address_space_memory).uc == (uc_struct_conflict12 *)0xffffffffffffffff) ||
     (*(RAMBlock **)&uc_local->errnum == (RAMBlock *)0x0)) {
    g_free(uc_local);
    uc_local = (uc_struct_conflict9 *)0x0;
  }
  else {
    memory_region_transaction_begin_sparc64();
    __dest = ramblock_ptr(*(RAMBlock **)&uc_local->errnum,0);
    __src = ramblock_ptr(current->ram_block,offset_00 - hVar1);
    memcpy(__dest,__src,size);
    memory_region_add_subregion_overlap_sparc64
              (current->container,offset_00,(MemoryRegion *)uc_local,uc->snapshot_level);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_sparc64(uc->cpu);
    }
    uc->memory_region_update_pending = true;
    memory_region_transaction_commit_sparc64((MemoryRegion *)uc_local);
  }
  return (MemoryRegion *)uc_local;
}

Assistant:

MemoryRegion *memory_cow(struct uc_struct *uc, MemoryRegion *current, hwaddr begin, size_t size)
{
    hwaddr offset;
    hwaddr current_offset;
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    if (current->container == uc->system_memory) {
        make_contained(uc, current);
    }
    offset = begin - current->container->addr;;
    current_offset = offset - current->addr;

    memory_region_init_ram(uc, ram, size, current->perms);
    if (ram->addr == -1 || !ram->ram_block) {
        g_free(ram);
        return NULL;
    }
    memory_region_transaction_begin();

    memcpy(ramblock_ptr(ram->ram_block, 0), ramblock_ptr(current->ram_block, current_offset), size);
    memory_region_add_subregion_overlap(current->container, offset, ram, uc->snapshot_level);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    uc->memory_region_update_pending = true;
    memory_region_transaction_commit(ram);

    return ram;
}